

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

uint32 add_ctab_typeinfo(Context_conflict *ctx,MOJOSHADER_symbolTypeInfo *info)

{
  uint32 uVar1;
  anon_union_8_3_d182c7ca ptr;
  uint8 bytes [16];
  MOJOSHADER_symbolTypeInfo *info_local;
  Context_conflict *ctx_local;
  
  ptr._0_2_ = (undefined2)info->parameter_class;
  ptr._2_2_ = (undefined2)info->parameter_type;
  ptr._4_2_ = (undefined2)info->rows;
  ptr._6_2_ = (undefined2)info->columns;
  bytes._0_2_ = (undefined2)info->elements;
  bytes._2_2_ = (undefined2)info->member_count;
  bytes._8_8_ = info;
  bytes._4_4_ = add_ctab_members(ctx,info);
  uVar1 = add_ctab_bytes(ctx,(uint8 *)&ptr,0x10);
  return uVar1;
}

Assistant:

static uint32 add_ctab_typeinfo(Context *ctx, const MOJOSHADER_symbolTypeInfo *info)
{
    uint8 bytes[CTYPEINFO_SIZE];
    union { uint8 *ui8; uint16 *ui16; uint32 *ui32; } ptr;
    ptr.ui8 = bytes;

    *(ptr.ui16++) = SWAP16((uint16) info->parameter_class);
    *(ptr.ui16++) = SWAP16((uint16) info->parameter_type);
    *(ptr.ui16++) = SWAP16((uint16) info->rows);
    *(ptr.ui16++) = SWAP16((uint16) info->columns);
    *(ptr.ui16++) = SWAP16((uint16) info->elements);
    *(ptr.ui16++) = SWAP16((uint16) info->member_count);
    *(ptr.ui32++) = SWAP32(add_ctab_members(ctx, info));

    return add_ctab_bytes(ctx, bytes, sizeof (bytes));
}